

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero-delay-observer.cpp
# Opt level: O2

void __thiscall
stateObservation::ZeroDelayObserver::setCurrentState(ZeroDelayObserver *this,StateVector *x_k)

{
  uint __line;
  int iVar1;
  char *__assertion;
  
  if ((this->x_).super_DebugItem<bool,_stateObservation::DebugItemDefaultValue<bool,_true>,_true>.b_
      == false) {
    __assertion = "x_.isSet() && \"The state vector has not been set\"";
    __line = 0x22;
  }
  else {
    iVar1 = (*(this->super_ObserverBase)._vptr_ObserverBase[0x14])();
    if ((char)iVar1 != '\0') {
      IndexedMatrixT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_false>::check_(&this->x_);
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
                (&(this->x_).v_,x_k);
      return;
    }
    __assertion = "checkStateVector(x_k) && \"The size of the state vector is incorrect\"";
    __line = 0x23;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/src/zero-delay-observer.cpp"
                ,__line,
                "virtual void stateObservation::ZeroDelayObserver::setCurrentState(const ObserverBase::StateVector &)"
               );
}

Assistant:

void ZeroDelayObserver::setCurrentState(const ObserverBase::StateVector & x_k)
{
  BOOST_ASSERT(x_.isSet() && "The state vector has not been set");
  BOOST_ASSERT(checkStateVector(x_k) && "The size of the state vector is incorrect");

  x_() = x_k;
}